

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O2

void lzma_lzma_optimum_normal
               (lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  lzma_match *matches;
  lzma_optimal *plVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  lzma_lzma_state lVar6;
  uint8_t *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint32_t uVar11;
  uint uVar12;
  int iVar13;
  uint32_t uVar14;
  uint uVar15;
  uint32_t uVar16;
  int iVar17;
  uint32_t uVar18;
  uint uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  lzma_lzma_state lVar26;
  lzma_lzma_state lVar27;
  ulong uVar28;
  uint32_t *puVar29;
  lzma_lzma_state pos_state;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  lzma_coder_conflict9 *plVar33;
  uint uVar34;
  lzma_lzma_state lVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  uint32_t *puVar41;
  ulong uVar42;
  byte bVar43;
  uint uVar44;
  int iVar45;
  uint32_t (*pauVar46) [64];
  short *psVar47;
  uint32_t i;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  uint32_t (*pauVar51) [128];
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong local_178;
  uint local_11c;
  uint32_t reps [4];
  
  uVar24 = coder->opts_current_index;
  uVar14 = mf->read_ahead;
  if (coder->opts_end_index == uVar24) {
    if (uVar14 == 0) {
      if (0x7f < coder->match_price_count) {
        pauVar46 = coder->pos_slot_prices;
        pauVar51 = coder->distances_prices;
        plVar33 = coder;
        for (lVar48 = 0; lVar48 != 4; lVar48 = lVar48 + 1) {
          for (uVar39 = 0; uVar40 = (ulong)coder->dist_table_size, uVar39 < uVar40;
              uVar39 = uVar39 + 1) {
            uVar11 = rc_bittree_price(coder->pos_slot[lVar48],6,(uint32_t)uVar39);
            (*pauVar46)[uVar39] = uVar11;
          }
          uVar24 = 0x70;
          for (lVar22 = 0x40b2; lVar22 - 0x40a4U < uVar40; lVar22 = lVar22 + 1) {
            (plVar33->rc).symbols[lVar22 + -10] =
                 ((uVar24 & 0xfffffff0) + (plVar33->rc).symbols[lVar22 + -10]) - 0x50;
            uVar40 = (ulong)coder->dist_table_size;
            uVar24 = uVar24 + 8;
          }
          for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
            (*pauVar51)[lVar22] = (*pauVar46)[lVar22];
          }
          pauVar46 = pauVar46 + 1;
          plVar33 = (lzma_coder_conflict9 *)((plVar33->rc).symbols + 0x36);
          pauVar51 = pauVar51 + 1;
        }
        puVar41 = coder->distances_prices[0] + 4;
        for (lVar48 = 4; lVar48 != 0x80; lVar48 = lVar48 + 1) {
          bVar2 = ""[lVar48];
          uVar11 = (bVar2 >> 1) - 1;
          uVar24 = (bVar2 & 1 | 2) << ((byte)uVar11 & 0x1f);
          uVar11 = rc_bittree_reverse_price
                             ((probability *)
                              ((long)coder + ((ulong)uVar24 * 2 - (ulong)((uint)bVar2 * 2)) + 0x70fa
                              ),uVar11,(int)lVar48 - uVar24);
          for (lVar22 = 0; lVar22 != 0x400; lVar22 = lVar22 + 0x100) {
            *(uint32_t *)((long)puVar41 + lVar22 * 2) =
                 *(int *)((long)coder->pos_slot_prices[0] + lVar22 + (ulong)bVar2 * 4) + uVar11;
          }
          puVar41 = puVar41 + 1;
        }
        coder->match_price_count = 0;
      }
      if (0xf < coder->align_price_count) {
        for (lVar48 = 0; lVar48 != 0x10; lVar48 = lVar48 + 1) {
          uVar11 = rc_bittree_reverse_price(coder->pos_align,4,(uint32_t)lVar48);
          coder->align_prices[lVar48] = uVar11;
        }
        coder->align_price_count = 0;
      }
    }
    uVar24 = mf->nice_len;
    if (uVar14 == 1) {
      local_11c = coder->matches_count;
      uVar12 = coder->longest_match_length;
    }
    else {
      if (uVar14 != 0) {
        __assert_fail("mf->read_ahead == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                      ,0x136,
                      "uint32_t helper1(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                     );
      }
      uVar12 = lzma_mf_find(mf,&local_11c,coder->matches);
    }
    uVar39 = (ulong)mf->read_pos;
    uVar25 = (mf->write_pos - mf->read_pos) + 1;
    uVar15 = 0x111;
    if ((uVar25 < 0x111) && (uVar15 = uVar25, uVar25 < 2)) {
      *back_res = 0xffffffff;
      *len_res = 1;
    }
    else {
      puVar7 = mf->buffer;
      puVar41 = coder->reps;
      sVar5 = *(short *)(puVar7 + (uVar39 - 1));
      uVar25 = 0;
      for (lVar48 = 0; lVar48 != 4; lVar48 = lVar48 + 1) {
        if (sVar5 == *(short *)(puVar7 + (uVar39 - 2) + -(ulong)puVar41[lVar48])) {
          for (uVar40 = 2; uVar40 < uVar15; uVar40 = uVar40 + 1) {
            if (puVar7[uVar40 + (uVar39 - 1)] != puVar7[uVar40 + (uVar39 - puVar41[lVar48]) + -2])
            goto LAB_00412f00;
          }
          uVar40 = (ulong)uVar15;
LAB_00412f00:
          reps[lVar48] = (uint)uVar40;
          if (reps[uVar25] < (uint)uVar40) {
            uVar25 = (uint)lVar48;
          }
        }
        else {
          reps[lVar48] = 0;
        }
      }
      uVar15 = reps[uVar25];
      if (uVar15 < uVar24) {
        if (uVar12 < uVar24) {
          bVar2 = puVar7[~(ulong)*puVar41 + (uVar39 - 1)];
          bVar43 = (byte)sVar5;
          if (((uVar15 < 2) && (uVar12 < 2)) && (bVar2 != bVar43)) {
            *back_res = 0xffffffff;
          }
          else {
            lVar26 = coder->state;
            uVar49 = (ulong)lVar26;
            coder->opts[0].state = lVar26;
            uVar24 = coder->pos_mask & position;
            uVar40 = (ulong)(coder->is_match[uVar49][uVar24] >> 4);
            bVar3 = lzma_rc_prices[uVar40];
            uVar11 = get_literal_price(coder,position,(uint)puVar7[uVar39 - 2],6 < uVar49,
                                       (uint)bVar2,(uint)bVar43);
            coder->opts[1].price = uVar11 + bVar3;
            coder->opts[1].back_prev = 0xffffffff;
            coder->opts[1].prev_1_is_literal = false;
            bVar4 = lzma_rc_prices[uVar40 ^ 0x7f];
            uVar39 = (ulong)(coder->is_rep[uVar49] >> 4);
            iVar13 = (uint)lzma_rc_prices[uVar39 ^ 0x7f] + (uint)bVar4;
            uVar14 = 0xffffffff;
            if (bVar2 == bVar43) {
              uVar18 = get_short_rep_price(coder,lVar26,uVar24);
              uVar25 = uVar18 + iVar13;
              if (uVar25 < uVar11 + bVar3) {
                coder->opts[1].price = uVar25;
                coder->opts[1].back_prev = 0;
                coder->opts[1].prev_1_is_literal = false;
                uVar14 = 0;
              }
            }
            if (uVar15 < uVar12) {
              uVar15 = uVar12;
            }
            local_178 = (ulong)uVar15;
            if (1 < uVar15) {
              coder->opts[1].pos_prev = 0;
              for (lVar48 = -4; auVar10 = _DAT_0049f980, auVar9 = _DAT_0049f970,
                  auVar8 = _DAT_0049f960, lVar48 != 0; lVar48 = lVar48 + 1) {
                coder->opts[1].backs[lVar48 + -7] = (&coder->matches[0].len)[lVar48];
              }
              lVar48 = (ulong)(uVar15 - 1) - 1;
              auVar53._8_4_ = (int)lVar48;
              auVar53._0_8_ = lVar48;
              auVar53._12_4_ = (int)((ulong)lVar48 >> 0x20);
              puVar29 = &coder->opts[local_178].price;
              uVar40 = 0;
              auVar53 = auVar53 ^ _DAT_0049f980;
              do {
                auVar54._8_4_ = (int)uVar40;
                auVar54._0_8_ = uVar40;
                auVar54._12_4_ = (int)(uVar40 >> 0x20);
                auVar55 = (auVar54 | auVar9) ^ auVar10;
                iVar17 = auVar53._4_4_;
                if ((bool)(~(auVar55._4_4_ == iVar17 && auVar53._0_4_ < auVar55._0_4_ ||
                            iVar17 < auVar55._4_4_) & 1)) {
                  *puVar29 = 0x40000000;
                }
                if ((auVar55._12_4_ != auVar53._12_4_ || auVar55._8_4_ <= auVar53._8_4_) &&
                    auVar55._12_4_ <= auVar53._12_4_) {
                  puVar29[-0xb] = 0x40000000;
                }
                auVar54 = (auVar54 | auVar8) ^ auVar10;
                iVar30 = auVar54._4_4_;
                if (iVar30 <= iVar17 && (iVar30 != iVar17 || auVar54._0_4_ <= auVar53._0_4_)) {
                  puVar29[-0x16] = 0x40000000;
                  puVar29[-0x21] = 0x40000000;
                }
                uVar40 = uVar40 + 4;
                puVar29 = puVar29 + -0x2c;
              } while (((ulong)(uVar15 - 1) + 3 & 0xfffffffffffffffc) != uVar40);
              for (lVar48 = 0; uVar25 = local_11c, lVar48 != 4; lVar48 = lVar48 + 1) {
                uVar40 = (ulong)reps[lVar48];
                if (1 < uVar40) {
                  uVar14 = get_pure_rep_price(coder,(uint32_t)lVar48,lVar26,uVar24);
                  puVar29 = &coder->opts[uVar40].back_prev;
                  do {
                    uVar49 = uVar40 - 1;
                    uVar25 = (coder->rep_len_encoder).prices[(ulong)uVar24 - 1][uVar40 + 0x10e] +
                             uVar14 + iVar13;
                    if (uVar25 < puVar29[-2]) {
                      puVar29[-2] = uVar25;
                      puVar29[-1] = 0;
                      *puVar29 = (uint32_t)lVar48;
                      *(_Bool *)(puVar29 + -5) = false;
                    }
                    puVar29 = puVar29 + -0xb;
                    uVar40 = uVar49;
                  } while ((uVar49 & 0xfffffffe) != 0);
                }
              }
              uVar40 = (ulong)(reps[0] + 1);
              if (reps[0] < 2) {
                uVar40 = 2;
              }
              if ((uint)uVar40 <= uVar12) {
                bVar2 = lzma_rc_prices[uVar39];
                uVar39 = 0xffffffffffffffff;
                do {
                  uVar39 = (ulong)((int)uVar39 + 1);
                } while (coder->matches[uVar39].len < (uint)uVar40);
                while( true ) {
                  uVar14 = coder->matches[uVar39].dist;
                  uVar18 = (uint32_t)uVar40;
                  uVar11 = get_pos_len_price(coder,uVar14,uVar18,uVar24);
                  uVar12 = uVar11 + (uint)bVar2 + (uint)bVar4;
                  if (uVar12 < coder->opts[uVar40].price) {
                    coder->opts[uVar40].price = uVar12;
                    coder->opts[uVar40].pos_prev = 0;
                    coder->opts[uVar40].back_prev = uVar14 + 4;
                    coder->opts[uVar40].prev_1_is_literal = false;
                  }
                  uVar14 = coder->matches[uVar39].len;
                  uVar12 = (int)uVar39 + 1;
                  if ((uVar18 == uVar14) && (uVar12 == uVar25)) break;
                  uVar49 = (ulong)uVar12;
                  if (uVar18 != uVar14) {
                    uVar49 = uVar39;
                  }
                  uVar40 = (ulong)(uVar18 + 1);
                  uVar39 = uVar49;
                }
              }
              if (uVar15 == 0xffffffff) {
                return;
              }
              reps._0_8_ = *(undefined8 *)puVar41;
              reps._8_8_ = *(undefined8 *)(coder->reps + 2);
              matches = coder->matches;
              puVar41 = coder->opts[1].backs;
              iVar13 = 2;
              uVar39 = 1;
              while( true ) {
                uVar40 = local_178 & 0xffffffff;
                uVar14 = (uint32_t)uVar39;
                if (uVar40 <= uVar39) break;
                if (uVar39 == 0x1000) {
                  __assert_fail("cur < OPTS",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                                ,0x38e,
                                "void lzma_lzma_optimum_normal(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                               );
                }
                uVar11 = lzma_mf_find(mf,&coder->matches_count,matches);
                coder->longest_match_length = uVar11;
                uVar24 = mf->nice_len;
                if (uVar24 <= uVar11) break;
                puVar7 = mf->buffer;
                uVar49 = (ulong)mf->read_pos;
                uVar15 = (mf->write_pos - mf->read_pos) + 1;
                uVar12 = 0xfff - uVar14;
                if (uVar15 < 0xfff - uVar14) {
                  uVar12 = uVar15;
                }
                uVar15 = coder->matches_count;
                plVar1 = coder->opts + uVar39;
                uVar25 = coder->opts[uVar39].pos_prev;
                uVar23 = (ulong)uVar25;
                if (coder->opts[uVar39].prev_1_is_literal == true) {
                  uVar25 = uVar25 - 1;
                  if (plVar1->prev_2 == true) {
                    lVar26 = coder->opts[plVar1->pos_prev_2].state;
                    if (plVar1->back_prev_2 < 4) {
                      lVar35 = (uint)(STATE_SHORTREP_LIT < lVar26) * 3 + STATE_LIT_LONGREP;
                    }
                    else {
                      lVar35 = (uint)(STATE_SHORTREP_LIT < lVar26) * 3 + STATE_LIT_MATCH;
                    }
                  }
                  else {
                    lVar35 = coder->opts[uVar25].state;
                  }
                  lVar26 = (lVar35 - STATE_SHORTREP_LIT) + (uint)(lVar35 < STATE_NONLIT_MATCH) * 3;
                  if (lVar35 < STATE_MATCH_LIT) {
                    lVar26 = STATE_LIT_LIT;
                  }
                  if (uVar39 == uVar23) {
LAB_004134ca:
                    if (plVar1->back_prev == 0) {
                      uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar26) * 2 + 9);
                    }
                    else {
                      uVar23 = (ulong)((lVar26 - STATE_SHORTREP_LIT) +
                                      (uint)(lVar26 < STATE_NONLIT_MATCH) * 3);
                      if (lVar26 < STATE_MATCH_LIT) {
                        uVar23 = 0;
                      }
                    }
                  }
                  else {
                    if (plVar1->prev_2 == false) goto LAB_004137b8;
                    uVar25 = plVar1->pos_prev_2;
                    uVar44 = plVar1->back_prev_2;
                    uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar26) * 3 + 8);
                    if (uVar44 < 4) goto LAB_004137d1;
LAB_0041383f:
                    reps[0] = uVar44 - 4;
                    for (lVar48 = 0; lVar48 != 3; lVar48 = lVar48 + 1) {
                      reps[lVar48 + 1] = coder->opts[uVar25].backs[lVar48];
                    }
                  }
                }
                else {
                  lVar26 = coder->opts[uVar23].state;
                  if (uVar39 - 1 == uVar23) goto LAB_004134ca;
LAB_004137b8:
                  uVar44 = plVar1->back_prev;
                  if (3 < uVar44) {
                    uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar26) * 3 + 7);
                    goto LAB_0041383f;
                  }
                  uVar23 = (ulong)((uint)(STATE_SHORTREP_LIT < lVar26) * 3 + 8);
LAB_004137d1:
                  uVar42 = (ulong)uVar44;
                  reps[0] = coder->opts[uVar25].backs[uVar42];
                  for (uVar50 = 0; uVar42 != uVar50; uVar50 = uVar50 + 1) {
                    reps[uVar50 + 1] = coder->opts[uVar25].backs[uVar50];
                  }
                  while (uVar42 + 1 < 4) {
                    reps[uVar42 + 1] = coder->opts[uVar25].backs[uVar42 + 1];
                    uVar42 = uVar42 + 1;
                  }
                }
                lVar48 = uVar49 - 1;
                lVar26 = position + uVar14;
                lVar35 = (lzma_lzma_state)uVar23;
                plVar1->state = lVar35;
                for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
                  puVar41[lVar22] = reps[lVar22];
                }
                uVar18 = plVar1->price;
                bVar2 = puVar7[uVar49 - 1];
                uVar42 = reps._0_8_ & 0xffffffff;
                bVar43 = puVar7[(uVar49 - uVar42) + -2];
                lVar6 = coder->pos_mask;
                pos_state = lVar6 & lVar26;
                uVar50 = (ulong)(coder->is_match[uVar23][pos_state] >> 4);
                bVar3 = lzma_rc_prices[uVar50];
                uVar16 = get_literal_price(coder,lVar26,(uint)puVar7[uVar49 - 2],
                                           STATE_SHORTREP_LIT < lVar35,(uint)bVar43,(uint)bVar2);
                uVar44 = uVar16 + uVar18 + (uint)bVar3;
                uVar25 = coder->opts[uVar39 + 1].price;
                bVar52 = uVar44 < uVar25;
                if (bVar52) {
                  coder->opts[uVar39 + 1].price = uVar44;
                  coder->opts[uVar39 + 1].pos_prev = uVar14;
                  coder->opts[uVar39 + 1].back_prev = 0xffffffff;
                  coder->opts[uVar39 + 1].prev_1_is_literal = false;
                  uVar25 = uVar44;
                }
                iVar30 = uVar18 + lzma_rc_prices[uVar50 ^ 0x7f];
                uVar23 = (ulong)(coder->is_rep[uVar23] >> 4);
                iVar17 = (uint)lzma_rc_prices[uVar23 ^ 0x7f] + iVar30;
                if ((bVar43 == bVar2) &&
                   ((uVar39 <= coder->opts[uVar39 + 1].pos_prev ||
                    (coder->opts[uVar39 + 1].back_prev != 0)))) {
                  uVar18 = get_short_rep_price(coder,lVar35,pos_state);
                  uVar19 = uVar18 + iVar17;
                  if (uVar19 <= uVar25) {
                    coder->opts[uVar39 + 1].price = uVar19;
                    coder->opts[uVar39 + 1].pos_prev = uVar14;
                    coder->opts[uVar39 + 1].back_prev = 0;
                    coder->opts[uVar39 + 1].prev_1_is_literal = false;
                    bVar52 = true;
                  }
                }
                if (1 < uVar12) {
                  uVar25 = uVar24;
                  if (uVar12 < uVar24) {
                    uVar25 = uVar12;
                  }
                  if (bVar43 != bVar2 && !bVar52) {
                    uVar19 = uVar24 + 1;
                    if (uVar12 <= uVar24 + 1) {
                      uVar19 = uVar12;
                    }
                    iVar38 = uVar19 + (uVar19 == 0);
                    for (uVar50 = 1; uVar50 < uVar19; uVar50 = uVar50 + 1) {
                      if (puVar7[uVar50 + (uVar49 - 1)] != puVar7[uVar50 + (uVar49 - uVar42) + -2])
                      {
                        iVar38 = (int)uVar50;
                        break;
                      }
                    }
                    if (1 < iVar38 - 1U) {
                      uVar19 = (lVar35 - STATE_SHORTREP_LIT) +
                               (uint)(lVar35 < STATE_NONLIT_MATCH) * 3;
                      if (lVar35 < STATE_MATCH_LIT) {
                        uVar19 = 0;
                      }
                      lVar27 = lVar26 + STATE_MATCH_LIT_LIT & lVar6;
                      bVar2 = lzma_rc_prices[(ulong)(coder->is_match[uVar19][lVar27] >> 4) ^ 0x7f];
                      bVar43 = lzma_rc_prices[(ulong)(coder->is_rep[uVar19] >> 4) ^ 0x7f];
                      uVar42 = (ulong)(iVar38 + uVar14);
                      puVar29 = &coder->opts[uVar40 + 1].price;
                      for (; uVar40 < uVar42; uVar40 = uVar40 + 1) {
                        *puVar29 = 0x40000000;
                        puVar29 = puVar29 + 0xb;
                      }
                      uVar18 = get_rep_price(coder,iVar38 - 1U,uVar19,lVar27,(uint32_t)puVar29);
                      uVar44 = uVar18 + uVar44 + bVar2 + (uint)bVar43;
                      if (uVar44 < coder->opts[uVar42].price) {
                        coder->opts[uVar42].price = uVar44;
                        coder->opts[uVar42].pos_prev = (uint32_t)(uVar39 + 1);
                        coder->opts[uVar42].back_prev = 0;
                        coder->opts[uVar42].prev_1_is_literal = true;
                        coder->opts[uVar42].prev_2 = false;
                      }
                      local_178 = uVar40 & 0xffffffff;
                    }
                  }
                  sVar5 = *(short *)(puVar7 + (uVar49 - 1));
                  uVar40 = 2;
                  uVar44 = 2;
                  if (2 < uVar25) {
                    uVar44 = uVar25;
                  }
                  for (lVar22 = 0; uVar42 = local_178 & 0xffffffff, lVar22 != 4; lVar22 = lVar22 + 1
                      ) {
                    psVar47 = (short *)(puVar7 + ((uVar49 - 2) - (ulong)reps[lVar22]));
                    if (sVar5 == *psVar47) {
                      for (uVar50 = 2; uVar50 < uVar25; uVar50 = uVar50 + 1) {
                        if (puVar7[uVar50 + (uVar49 - 1)] !=
                            puVar7[uVar50 + (uVar49 - reps[lVar22]) + -2]) goto LAB_00413a51;
                      }
                      uVar50 = (ulong)uVar44;
LAB_00413a51:
                      iVar38 = (int)uVar50;
                      uVar19 = iVar38 + uVar14;
                      puVar29 = &coder->opts[uVar42 + 1].price;
                      for (; uVar42 < uVar19; uVar42 = uVar42 + 1) {
                        *puVar29 = 0x40000000;
                        puVar29 = puVar29 + 0xb;
                      }
                      uVar16 = (uint32_t)lVar22;
                      uVar18 = get_pure_rep_price(coder,uVar16,lVar35,pos_state);
                      iVar45 = uVar18 + iVar17;
                      uVar50 = uVar50 & 0xffffffff;
                      uVar28 = uVar39 + uVar50;
                      uVar36 = uVar50;
                      do {
                        uVar32 = uVar36 - 1;
                        uVar34 = (coder->rep_len_encoder).prices[(ulong)pos_state - 1]
                                 [uVar36 + 0x10e] + iVar45;
                        uVar36 = uVar28 & 0xffffffff;
                        if (uVar34 < coder->opts[uVar36].price) {
                          coder->opts[uVar36].price = uVar34;
                          coder->opts[uVar36].pos_prev = uVar14;
                          coder->opts[uVar36].back_prev = uVar16;
                          coder->opts[uVar36].prev_1_is_literal = false;
                        }
                        uVar28 = uVar28 - 1;
                        uVar36 = uVar32;
                      } while ((uVar32 & 0xfffffffe) != 0);
                      uVar34 = iVar38 + 1;
                      uVar28 = (ulong)uVar34;
                      if (lVar22 == 0) {
                        uVar40 = (ulong)uVar34;
                      }
                      uVar31 = uVar24 + iVar38 + 1;
                      if (uVar12 <= uVar31) {
                        uVar31 = uVar12;
                      }
                      uVar37 = uVar31;
                      if (uVar31 <= uVar34) {
                        uVar37 = uVar34;
                      }
                      for (; uVar28 < uVar31; uVar28 = uVar28 + 1) {
                        if (puVar7[uVar28 + (uVar49 - 1)] != *(uint8_t *)((long)psVar47 + uVar28)) {
                          uVar37 = (uint)uVar28;
                          break;
                        }
                      }
                      uVar37 = uVar37 - uVar34;
                      if (1 < uVar37) {
                        uVar18 = (coder->rep_len_encoder).prices[pos_state][iVar38 - 2];
                        bVar2 = lzma_rc_prices
                                [*(ushort *)
                                  ((long)coder->is_match[0] +
                                  (ulong)(iVar38 + lVar26 & lVar6) * 2 +
                                  (ulong)(((uint)(STATE_SHORTREP_LIT < lVar35) * 3 + 8) * 0x20)) >>
                                 4];
                        uVar20 = get_literal_price(coder,iVar38 + lVar26,
                                                   (uint)puVar7[(ulong)(iVar38 - 1) + lVar48],true,
                                                   (uint)*(byte *)((long)psVar47 + uVar50),
                                                   (uint)puVar7[uVar50 + lVar48]);
                        lVar27 = lVar26 + iVar38 + STATE_MATCH_LIT_LIT & lVar6;
                        bVar43 = lzma_rc_prices[(ulong)(coder->is_match[5][lVar27] >> 4) ^ 0x7f];
                        bVar3 = lzma_rc_prices[(ulong)(coder->is_rep[5] >> 4) ^ 0x7f];
                        uVar50 = (ulong)(uVar19 + uVar37 + 1);
                        for (; uVar42 < uVar50; uVar42 = uVar42 + 1) {
                          *puVar29 = 0x40000000;
                          puVar29 = puVar29 + 0xb;
                        }
                        uVar21 = get_rep_price(coder,uVar37,5,lVar27,(uint)bVar3);
                        uVar34 = uVar21 + uVar18 + iVar45 + (uint)bVar2 + uVar20 + (uint)bVar43 +
                                          (uint)bVar3;
                        if (uVar34 < coder->opts[uVar50].price) {
                          coder->opts[uVar50].price = uVar34;
                          coder->opts[uVar50].pos_prev = uVar19 + 1;
                          coder->opts[uVar50].back_prev = 0;
                          coder->opts[uVar50].prev_1_is_literal = true;
                          coder->opts[uVar50].prev_2 = true;
                          coder->opts[uVar50].pos_prev_2 = uVar14;
                          coder->opts[uVar50].back_prev_2 = uVar16;
                          local_178 = uVar42 & 0xffffffff;
                          goto LAB_00413d07;
                        }
                      }
                      local_178 = uVar42 & 0xffffffff;
                    }
LAB_00413d07:
                  }
                  if (uVar25 < uVar11) {
                    uVar15 = 0;
                    do {
                      uVar44 = uVar15;
                      uVar15 = uVar44 + 1;
                    } while (matches[uVar44].len < uVar25);
                    matches[uVar44].len = uVar25;
                    uVar11 = uVar25;
                  }
                  if ((uint)uVar40 <= uVar11) {
                    bVar2 = lzma_rc_prices[uVar23];
                    puVar29 = &coder->opts[uVar42 + 1].price;
                    for (; uVar42 < uVar11 + uVar14; uVar42 = uVar42 + 1) {
                      *puVar29 = 0x40000000;
                      puVar29 = puVar29 + 0xb;
                    }
                    uVar23 = 0xffffffff;
                    do {
                      uVar23 = (ulong)((int)uVar23 + 1);
                    } while (matches[uVar23].len < (uint)uVar40);
                    local_178 = uVar42 & 0xffffffff;
                    uVar42 = uVar40;
                    do {
                      uVar11 = matches[uVar23].len;
                      uVar25 = coder->matches[uVar23].dist;
                      iVar17 = (int)uVar42;
                      uVar44 = iVar13 + iVar17;
                      iVar38 = (int)uVar40;
                      while( true ) {
                        uVar16 = (uint32_t)uVar40;
                        uVar18 = get_pos_len_price(coder,uVar25,uVar16,pos_state);
                        uVar19 = uVar18 + iVar30 + (uint)bVar2;
                        uVar34 = uVar16 + uVar14;
                        if (uVar19 < coder->opts[uVar34].price) {
                          coder->opts[uVar34].price = uVar19;
                          coder->opts[uVar34].pos_prev = uVar14;
                          coder->opts[uVar34].back_prev = uVar25 + 4;
                          coder->opts[uVar34].prev_1_is_literal = false;
                        }
                        uVar42 = (ulong)((int)uVar42 + 1);
                        if (uVar16 == uVar11) break;
                        uVar40 = (ulong)(uVar16 + 1);
                        uVar44 = uVar44 + 1;
                      }
                      lVar22 = (uVar49 - 2) - (ulong)uVar25;
                      uVar31 = uVar24 + uVar16 + 1;
                      if (uVar12 <= uVar31) {
                        uVar31 = uVar12;
                      }
                      uVar37 = iVar17 - iVar38;
                      for (uVar50 = uVar42;
                          (uVar50 < uVar31 &&
                          (puVar7[uVar50 + (uVar49 - 1)] == puVar7[uVar50 + lVar22]));
                          uVar50 = uVar50 + 1) {
                        uVar37 = uVar37 + 1;
                        uVar44 = uVar44 + 1;
                      }
                      if (1 < uVar37) {
                        lVar27 = uVar16 + lVar26 & lVar6;
                        bVar43 = lzma_rc_prices
                                 [*(ushort *)
                                   ((long)coder->is_match[0] +
                                   (ulong)lVar27 * 2 +
                                   (ulong)(((uint)(STATE_SHORTREP_LIT < lVar35) * 3 + 7) * 0x20)) >>
                                  4];
                        uVar11 = get_literal_price(coder,uVar16 + lVar26,
                                                   (uint)puVar7[(ulong)(uVar16 - 1) + lVar48],true,
                                                   (uint)puVar7[uVar40 + lVar22],
                                                   (uint)puVar7[uVar40 + lVar48]);
                        lVar27 = lVar27 + STATE_MATCH_LIT_LIT & lVar6;
                        bVar3 = lzma_rc_prices[(ulong)(coder->is_match[4][lVar27] >> 4) ^ 0x7f];
                        bVar4 = lzma_rc_prices[(ulong)(coder->is_rep[4] >> 4) ^ 0x7f];
                        local_178 = local_178 & 0xffffffff;
                        uVar40 = (ulong)uVar44;
                        puVar29 = &coder->opts[local_178 + 1].price;
                        for (; local_178 < uVar40; local_178 = local_178 + 1) {
                          *puVar29 = 0x40000000;
                          puVar29 = puVar29 + 0xb;
                        }
                        uVar18 = get_rep_price(coder,uVar37,4,lVar27,(uint32_t)puVar29);
                        uVar44 = uVar18 + uVar19 + bVar43 + uVar11 + (uint)bVar3 + (uint)bVar4;
                        if (uVar44 < coder->opts[uVar40].price) {
                          coder->opts[uVar40].price = uVar44;
                          coder->opts[uVar40].pos_prev = uVar34 + 1;
                          coder->opts[uVar40].back_prev = 0;
                          coder->opts[uVar40].prev_1_is_literal = true;
                          coder->opts[uVar40].prev_2 = true;
                          coder->opts[uVar40].pos_prev_2 = uVar14;
                          coder->opts[uVar40].back_prev_2 = uVar25 + 4;
                        }
                      }
                      uVar40 = (ulong)(uVar16 + 1);
                      uVar25 = (int)uVar23 + 1;
                      uVar23 = (ulong)uVar25;
                    } while (uVar25 != uVar15);
                  }
                }
                puVar41 = puVar41 + 0xb;
                iVar13 = iVar13 + 1;
                uVar39 = uVar39 + 1;
              }
              uVar24 = coder->opts[uVar39 & 0xffffffff].pos_prev;
              uVar11 = coder->opts[uVar39 & 0xffffffff].back_prev;
              coder->opts_end_index = uVar14;
              do {
                uVar49 = (ulong)uVar24;
                uVar40 = uVar39 & 0xffffffff;
                if (coder->opts[uVar40].prev_1_is_literal == false) {
                  uVar12 = coder->opts[uVar49].pos_prev;
                  uVar14 = coder->opts[uVar49].back_prev;
                }
                else {
                  coder->opts[uVar49].prev_1_is_literal = false;
                  uVar12 = uVar24 - 1;
                  if (coder->opts[uVar40].prev_2 == true) {
                    coder->opts[uVar12].prev_1_is_literal = false;
                    uVar14 = coder->opts[uVar40].back_prev_2;
                    coder->opts[uVar12].pos_prev = coder->opts[uVar40].pos_prev_2;
                    coder->opts[uVar12].back_prev = uVar14;
                  }
                  uVar14 = 0xffffffff;
                }
                coder->opts[uVar49].back_prev = uVar11;
                coder->opts[uVar49].pos_prev = (uint32_t)uVar39;
                bVar52 = uVar24 != 0;
                uVar39 = uVar49;
                uVar24 = uVar12;
                uVar11 = uVar14;
              } while (bVar52);
              uVar14 = coder->opts[0].pos_prev;
              coder->opts_current_index = uVar14;
              *len_res = uVar14;
              *back_res = coder->opts[0].back_prev;
              return;
            }
            *back_res = uVar14;
          }
          *len_res = 1;
          return;
        }
        *back_res = coder->matches[local_11c - 1].dist + 4;
        *len_res = uVar12;
        uVar15 = uVar12;
      }
      else {
        *back_res = uVar25;
        *len_res = uVar15;
      }
      mf_skip(mf,uVar15 - 1);
    }
  }
  else {
    if (uVar14 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x36e,
                    "void lzma_lzma_optimum_normal(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar14 = coder->opts[uVar24].pos_prev;
    uVar11 = coder->opts[uVar24].back_prev;
    coder->opts_current_index = uVar14;
    *len_res = uVar14 - uVar24;
    *back_res = uVar11;
  }
  return;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res,
		uint32_t position)
{
	uint32_t reps[REP_DISTANCES];
	uint32_t len_end;
	uint32_t cur;

	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_distances_prices(coder);

		if (coder->align_price_count >= ALIGN_TABLE_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;


	memcpy(reps, coder->reps, sizeof(reps));

	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}